

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O0

void __thiscall
MingwMakefileGenerator::writeObjectsPart(MingwMakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  Win32MakefileGenerator *in_RSI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char> QVar2;
  QString ar_cmd;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
  *in_stack_fffffffffffffd50;
  QString *in_stack_fffffffffffffd58;
  QMakeProject *this_00;
  undefined7 in_stack_fffffffffffffd60;
  byte bVar3;
  undefined6 in_stack_fffffffffffffd70;
  byte in_stack_fffffffffffffd76;
  byte in_stack_fffffffffffffd77;
  char *in_stack_fffffffffffffd88;
  MakefileGenerator *in_stack_fffffffffffffda0;
  undefined1 local_228 [24];
  undefined1 local_210 [48];
  undefined1 local_1e0 [24];
  QString *local_1c8;
  char local_1c0;
  undefined1 local_1b1;
  undefined1 local_198 [48];
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  QString *local_d8;
  char local_d0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::maybeCreateLinkerResponseFile(in_stack_fffffffffffffda0);
  MakefileGenerator::LinkerResponseFileInfo::operator=
            ((LinkerResponseFileInfo *)in_stack_fffffffffffffd50,
             (LinkerResponseFileInfo *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48)
            );
  MakefileGenerator::LinkerResponseFileInfo::~LinkerResponseFileInfo
            ((LinkerResponseFileInfo *)0x2360a3);
  bVar1 = MakefileGenerator::LinkerResponseFileInfo::isValid((LinkerResponseFileInfo *)0x2360b4);
  if (bVar1) {
    this_00 = (QMakeProject *)(in_RDI->m_superfile).d.size;
    QString::QString((QString *)this_00,in_stack_fffffffffffffd88);
    bVar1 = QMakeProject::isActiveConfig
                      (this_00,(QString *)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd4f)
    ;
    in_stack_fffffffffffffd77 = 0;
    in_stack_fffffffffffffd76 = 0;
    bVar3 = false;
    if (bVar1) {
      in_stack_fffffffffffffd50 =
           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
            *)(in_RDI->m_superfile).d.size;
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd50,
                     (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      in_stack_fffffffffffffd77 = 1;
      QMakeEvaluator::first(in_RDI,(ProKey *)CONCAT17(bVar3,in_stack_fffffffffffffd60));
      in_stack_fffffffffffffd76 = 1;
      bVar3 = ProString::operator==
                        ((ProString *)
                         CONCAT17(in_stack_fffffffffffffd77,CONCAT16(1,in_stack_fffffffffffffd70)),
                         (char *)in_RDI);
    }
    if ((in_stack_fffffffffffffd76 & 1) != 0) {
      ProString::~ProString((ProString *)0x2361a6);
    }
    if ((in_stack_fffffffffffffd77 & 1) != 0) {
      ProKey::~ProKey((ProKey *)0x2361bc);
    }
    QString::~QString((QString *)0x2361c9);
    if ((bVar3 & 1) == 0) {
      (*(code *)(in_RDI->m_caller->m_extraConfigs).super_QList<ProString>.d.ptr)
                (&stack0xfffffffffffffd88,in_RDI,&in_RDI->m_stashfile);
      ::operator+((char (*) [2])this_00,(QString *)in_stack_fffffffffffffd50);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_char_(&)[2],_QString> *)
                 CONCAT17(bVar3,in_stack_fffffffffffffd48));
      QString::operator=((QString *)in_stack_fffffffffffffd50,
                         (QString *)CONCAT17(bVar3,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x23644f);
      QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[2],_QString> *)0x236459);
      QString::~QString((QString *)0x236463);
    }
    else {
      local_168 = 0xaaaaaaaaaaaaaaaa;
      local_160 = 0xaaaaaaaaaaaaaaaa;
      local_158 = 0xaaaaaaaaaaaaaaaa;
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd50,
                     (char *)CONCAT17(bVar3,in_stack_fffffffffffffd48));
      (*(code *)(in_RDI->m_caller->m_qmakespecName).d.d)(&local_168,in_RDI,local_198);
      ProKey::~ProKey((ProKey *)0x236242);
      bVar1 = QString::isEmpty((QString *)0x23624f);
      if (bVar1) {
        QString::operator=((QString *)this_00,(char *)in_RSI);
      }
      local_1b1 = 0x20;
      QVar2 = ::operator+((QString *)this_00,(char *)in_stack_fffffffffffffd50);
      local_1c8 = QVar2.a;
      local_1c0 = QVar2.b;
      local_d8 = local_1c8;
      local_d0 = local_1c0;
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd50,
                     (char *)CONCAT17(bVar3,in_stack_fffffffffffffd48));
      (*(code *)(in_RDI->m_caller->m_qmakespecName).d.d)(local_1e0,in_RDI,local_210);
      ::operator+((QStringBuilder<QString_&,_char> *)this_00,(QString *)in_stack_fffffffffffffd50);
      ::operator+((QStringBuilder<QStringBuilder<QString_&,_char>,_QString> *)this_00,
                  (char (*) [3])in_stack_fffffffffffffd50);
      (*(code *)(in_RDI->m_caller->m_extraConfigs).super_QList<ProString>.d.ptr)
                (local_228,in_RDI,&in_RDI->m_stashfile);
      ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>
                   *)this_00,(QString *)in_stack_fffffffffffffd50);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                  *)CONCAT17(bVar3,in_stack_fffffffffffffd48));
      QString::operator=((QString *)in_stack_fffffffffffffd50,
                         (QString *)CONCAT17(bVar3,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x236393);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
      ::~QStringBuilder(in_stack_fffffffffffffd50);
      QString::~QString((QString *)0x2363ad);
      QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>::
      ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>
                       *)0x2363ba);
      QStringBuilder<QStringBuilder<QString_&,_char>,_QString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString_&,_char>,_QString> *)0x2363c7);
      QString::~QString((QString *)0x2363d4);
      ProKey::~ProKey((ProKey *)0x2363e1);
      QString::~QString((QString *)0x2363ee);
    }
  }
  else {
    QString::operator=(in_stack_fffffffffffffd58,(char *)in_RSI);
  }
  Win32MakefileGenerator::writeObjectsPart
            (in_RSI,(QTextStream *)
                    CONCAT17(in_stack_fffffffffffffd77,
                             CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MingwMakefileGenerator::writeObjectsPart(QTextStream &t)
{
    linkerResponseFile = maybeCreateLinkerResponseFile();
    if (!linkerResponseFile.isValid()) {
        objectsLinkLine = "$(OBJECTS)";
    } else if (project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        // QMAKE_LIB is used for win32, including mingw, whereas QMAKE_AR is used on Unix.
        QString ar_cmd = var("QMAKE_LIB");
        if (ar_cmd.isEmpty())
            ar_cmd = "ar -rc";
        objectsLinkLine = ar_cmd + ' ' + var("DEST_TARGET") + " @"
            + escapeFilePath(linkerResponseFile.filePath);
    } else {
        objectsLinkLine = "@" + escapeFilePath(linkerResponseFile.filePath);
    }
    Win32MakefileGenerator::writeObjectsPart(t);
}